

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmIfElse(ExpressionContext *ctx,VmModule *module,ExprIfElse *node)

{
  VmValue *pVVar1;
  VmBlock *block;
  VmBlock *block_00;
  VmBlock *block_01;
  VmBlock *exitBlock;
  VmBlock *falseBlock;
  VmBlock *trueBlock;
  VmValue *condition;
  ExprIfElse *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = CompileVm(ctx,module,node->condition);
  block = anon_unknown.dwarf_c91b1::CreateBlock(module,(node->super_ExprBase).source,"if_true");
  block_00 = anon_unknown.dwarf_c91b1::CreateBlock(module,(node->super_ExprBase).source,"if_false");
  block_01 = anon_unknown.dwarf_c91b1::CreateBlock(module,(node->super_ExprBase).source,"if_exit");
  if (node->falseBlock == (ExprBase *)0x0) {
    anon_unknown.dwarf_c91b1::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
               &block_01->super_VmValue);
  }
  else {
    anon_unknown.dwarf_c91b1::CreateJumpNotZero
              (module,(node->super_ExprBase).source,pVVar1,&block->super_VmValue,
               &block_00->super_VmValue);
  }
  VmFunction::AddBlock(module->currentFunction,block);
  module->currentBlock = block;
  CompileVm(ctx,module,node->trueBlock);
  anon_unknown.dwarf_c91b1::CreateJump
            (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  if (node->falseBlock != (ExprBase *)0x0) {
    VmFunction::AddBlock(module->currentFunction,block_00);
    module->currentBlock = block_00;
    CompileVm(ctx,module,node->falseBlock);
    anon_unknown.dwarf_c91b1::CreateJump
              (module,(node->super_ExprBase).source,&block_01->super_VmValue);
  }
  VmFunction::AddBlock(module->currentFunction,block_01);
  module->currentBlock = block_01;
  pVVar1 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmIfElse(ExpressionContext &ctx, VmModule *module, ExprIfElse *node)
{
	VmValue* condition = CompileVm(ctx, module, node->condition);

	VmBlock *trueBlock = CreateBlock(module, node->source, "if_true");
	VmBlock *falseBlock = CreateBlock(module, node->source, "if_false");
	VmBlock *exitBlock = CreateBlock(module, node->source, "if_exit");

	if(node->falseBlock)
		CreateJumpNotZero(module, node->source, condition, trueBlock, falseBlock);
	else
		CreateJumpNotZero(module, node->source, condition, trueBlock, exitBlock);

	module->currentFunction->AddBlock(trueBlock);
	module->currentBlock = trueBlock;

	CompileVm(ctx, module, node->trueBlock);

	CreateJump(module, node->source, exitBlock);

	if(node->falseBlock)
	{
		module->currentFunction->AddBlock(falseBlock);
		module->currentBlock = falseBlock;

		CompileVm(ctx, module, node->falseBlock);

		CreateJump(module, node->source, exitBlock);
	}

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	return CheckType(ctx, node, CreateVoid(module));
}